

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthCountOnesInCofs(uint *pTruth,int nVars,int *pStore)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  bVar2 = (char)nVars - 5U & 0x1f;
  uVar8 = 1 << bVar2;
  uVar1 = (long)(int)uVar8 / 2;
  uVar10 = 0;
  memset(pStore,0,(long)nVars * 8);
  if (nVars < 6) {
    if (0 < nVars) {
      iVar3 = Kit_WordCountOnes(*pTruth & 0x55555555);
      *pStore = iVar3;
      iVar3 = Kit_WordCountOnes(*pTruth & 0xaaaaaaaa);
      pStore[1] = iVar3;
      if (nVars != 1) {
        iVar3 = Kit_WordCountOnes(*pTruth & 0x33333333);
        pStore[2] = iVar3;
        iVar3 = Kit_WordCountOnes(*pTruth & 0xcccccccc);
        pStore[3] = iVar3;
        if (2 < (uint)nVars) {
          iVar3 = Kit_WordCountOnes(*pTruth & 0xf0f0f0f);
          pStore[4] = iVar3;
          iVar3 = Kit_WordCountOnes(*pTruth & 0xf0f0f0f0);
          pStore[5] = iVar3;
          if (nVars != 3) {
            iVar3 = Kit_WordCountOnes(*pTruth & 0xff00ff);
            pStore[6] = iVar3;
            iVar3 = Kit_WordCountOnes(*pTruth & 0xff00ff00);
            pStore[7] = iVar3;
            if (nVars == 5) {
              iVar3 = Kit_WordCountOnes((uint)(ushort)*pTruth);
              pStore[8] = iVar3;
              iVar3 = Kit_WordCountOnes((uint)*(ushort *)((long)pTruth + 2) << 0x10);
              pStore[9] = iVar3;
            }
          }
        }
      }
    }
  }
  else {
    uVar9 = (ulong)uVar8;
    if (1 << bVar2 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      iVar3 = Kit_WordCountOnes(pTruth[uVar10]);
      piVar6 = pStore + 10;
      for (lVar5 = 0; (ulong)(uint)nVars - 5 != lVar5; lVar5 = lVar5 + 1) {
        piVar7 = piVar6 + 1;
        if (((uint)uVar10 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
          piVar7 = piVar6;
        }
        *piVar7 = *piVar7 + iVar3;
        piVar6 = piVar6 + 2;
      }
    }
    uVar9 = 0;
    uVar10 = uVar1 & 0xffffffff;
    if ((int)uVar1 < 1) {
      uVar10 = uVar9;
    }
    iVar3 = (int)uVar10;
    if (nVars < 6) {
      iVar3 = 0;
    }
    for (; iVar3 != (int)uVar9; uVar9 = uVar9 + 1) {
      iVar4 = Kit_WordCountOnes((pTruth[uVar9 * 2] & 0x55555555) +
                                (pTruth[uVar9 * 2 + 1] & 0xd5555555) * 2);
      *pStore = *pStore + iVar4;
      iVar4 = Kit_WordCountOnes(pTruth[uVar9 * 2 + 1] >> 1 & 0x55555555 |
                                pTruth[uVar9 * 2] & 0xaaaaaaaa);
      pStore[1] = pStore[1] + iVar4;
      iVar4 = Kit_WordCountOnes((pTruth[uVar9 * 2] & 0x33333333) +
                                (pTruth[uVar9 * 2 + 1] & 0xf3333333) * 4);
      pStore[2] = pStore[2] + iVar4;
      iVar4 = Kit_WordCountOnes(pTruth[uVar9 * 2 + 1] >> 2 & 0x33333333 |
                                pTruth[uVar9 * 2] & 0xcccccccc);
      pStore[3] = pStore[3] + iVar4;
      iVar4 = Kit_WordCountOnes((pTruth[uVar9 * 2 + 1] & 0xf0f0f0f) << 4 |
                                pTruth[uVar9 * 2] & 0xf0f0f0f);
      pStore[4] = pStore[4] + iVar4;
      iVar4 = Kit_WordCountOnes(pTruth[uVar9 * 2 + 1] >> 4 & 0xf0f0f0f |
                                pTruth[uVar9 * 2] & 0xf0f0f0f0);
      pStore[5] = pStore[5] + iVar4;
      iVar4 = Kit_WordCountOnes((pTruth[uVar9 * 2 + 1] & 0xff00ff) << 8 |
                                pTruth[uVar9 * 2] & 0xff00ff);
      pStore[6] = pStore[6] + iVar4;
      iVar4 = Kit_WordCountOnes(pTruth[uVar9 * 2 + 1] >> 8 & 0xff00ff |
                                pTruth[uVar9 * 2] & 0xff00ff00);
      pStore[7] = pStore[7] + iVar4;
      iVar4 = Kit_WordCountOnes(pTruth[uVar9 * 2 + 1] << 0x10 | (uint)(ushort)pTruth[uVar9 * 2]);
      pStore[8] = pStore[8] + iVar4;
      iVar4 = Kit_WordCountOnes(CONCAT22(*(undefined2 *)((long)pTruth + uVar9 * 8 + 2),
                                         *(undefined2 *)((long)pTruth + uVar9 * 8 + 6)));
      pStore[9] = pStore[9] + iVar4;
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs( unsigned * pTruth, int nVars, int * pStore )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * 2 * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
        {
            pStore[2*0+0] = Kit_WordCountOnes( pTruth[0] & 0x55555555 );
            pStore[2*0+1] = Kit_WordCountOnes( pTruth[0] & 0xAAAAAAAA );
        }
        if ( nVars > 1 )
        {
            pStore[2*1+0] = Kit_WordCountOnes( pTruth[0] & 0x33333333 );
            pStore[2*1+1] = Kit_WordCountOnes( pTruth[0] & 0xCCCCCCCC );
        }
        if ( nVars > 2 )
        {
            pStore[2*2+0] = Kit_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
            pStore[2*2+1] = Kit_WordCountOnes( pTruth[0] & 0xF0F0F0F0 );
        }
        if ( nVars > 3 )
        {
            pStore[2*3+0] = Kit_WordCountOnes( pTruth[0] & 0x00FF00FF );
            pStore[2*3+1] = Kit_WordCountOnes( pTruth[0] & 0xFF00FF00 );
        }
        if ( nVars > 4 )
        {
            pStore[2*4+0] = Kit_WordCountOnes( pTruth[0] & 0x0000FFFF );
            pStore[2*4+1] = Kit_WordCountOnes( pTruth[0] & 0xFFFF0000 );
        }
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( k & (1 << (i-5)) )
                pStore[2*i+1] += Counter;
            else
                pStore[2*i+0] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[2*0+0] += Kit_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[2*0+1] += Kit_WordCountOnes( (pTruth[0] & 0xAAAAAAAA) | ((pTruth[1] & 0xAAAAAAAA) >>  1) );
        pStore[2*1+0] += Kit_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2*1+1] += Kit_WordCountOnes( (pTruth[0] & 0xCCCCCCCC) | ((pTruth[1] & 0xCCCCCCCC) >>  2) );
        pStore[2*2+0] += Kit_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[2*2+1] += Kit_WordCountOnes( (pTruth[0] & 0xF0F0F0F0) | ((pTruth[1] & 0xF0F0F0F0) >>  4) );
        pStore[2*3+0] += Kit_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[2*3+1] += Kit_WordCountOnes( (pTruth[0] & 0xFF00FF00) | ((pTruth[1] & 0xFF00FF00) >>  8) );
        pStore[2*4+0] += Kit_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pStore[2*4+1] += Kit_WordCountOnes( (pTruth[0] & 0xFFFF0000) | ((pTruth[1] & 0xFFFF0000) >> 16) );
        pTruth += 2;
    }
}